

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

long __thiscall
mpt::reference_array<mpt::cycle>::clear(reference_array<mpt::cycle> *this,cycle *ref)

{
  content<mpt::reference<mpt::cycle>_> *pcVar1;
  cycle *pcVar2;
  content<mpt::reference<mpt::cycle>_> *pcVar3;
  content<mpt::reference<mpt::cycle>_> *d;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  pcVar1 = (this->super_unique_array<mpt::reference<mpt::cycle>_>)._ref._ref;
  pcVar3 = pcVar1 + 1;
  if (pcVar1 == (content<mpt::reference<mpt::cycle>_> *)0x0) {
    uVar4 = 0;
    pcVar3 = (content<mpt::reference<mpt::cycle>_> *)0x0;
  }
  else {
    uVar4 = (pcVar1->super_buffer)._used >> 3;
  }
  lVar6 = 0;
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    pcVar2 = (cycle *)(&(pcVar3->super_buffer)._vptr_buffer)[uVar5];
    if ((pcVar2 != (cycle *)0x0) && (ref == (cycle *)0x0 || pcVar2 == ref)) {
      (*(pcVar2->super_metatype).super_convertable._vptr_convertable[1])();
      (&(pcVar3->super_buffer)._vptr_buffer)[uVar5] = (_func_int **)0x0;
      lVar6 = lVar6 + 1;
    }
  }
  return lVar6;
}

Assistant:

long clear(const T *ref = 0) const
	{
		reference<T> *ptr = this->begin();
		long elem = 0;
		
		for (long i = 0, len = this->length(); i < len; ++i) {
			T *match = ptr[i].instance();
			if (!match || (ref && (match != ref))) {
				continue;
			}
			ptr[i].set_instance(0);
			++elem;
		}
		return elem;
	}